

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void mpi_dec_test_cmd_options(MpiDecTestCmd *cmd)

{
  MpiDecTestCmd *cmd_local;
  
  if (cmd->quiet == 0) {
    _mpp_log_l(4,"mpi_dec_utils","cmd parse result:\n",0);
    _mpp_log_l(4,"mpi_dec_utils","input  file name: %s\n",0,cmd);
    _mpp_log_l(4,"mpi_dec_utils","output file name: %s\n",0,cmd->file_output);
    _mpp_log_l(4,"mpi_dec_utils","width      : %4d\n",0,cmd->width);
    _mpp_log_l(4,"mpi_dec_utils","height     : %4d\n",0,cmd->height);
    _mpp_log_l(4,"mpi_dec_utils","type       : %4d\n",0,cmd->type);
    _mpp_log_l(4,"mpi_dec_utils","max frames : %4d\n",0,cmd->frame_num);
    if (cmd->file_slt != (char *)0x0) {
      _mpp_log_l(4,"mpi_dec_utils","verify     : %s\n",0,cmd->file_slt);
    }
  }
  return;
}

Assistant:

void mpi_dec_test_cmd_options(MpiDecTestCmd* cmd)
{
    if (cmd->quiet)
        return;

    mpp_log("cmd parse result:\n");
    mpp_log("input  file name: %s\n", cmd->file_input);
    mpp_log("output file name: %s\n", cmd->file_output);
    mpp_log("width      : %4d\n", cmd->width);
    mpp_log("height     : %4d\n", cmd->height);
    mpp_log("type       : %4d\n", cmd->type);
    mpp_log("max frames : %4d\n", cmd->frame_num);
    if (cmd->file_slt)
        mpp_log("verify     : %s\n", cmd->file_slt);
}